

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsmooth.c
# Opt level: O0

FT_Error ft_smooth_render(FT_Renderer_conflict render,FT_GlyphSlot slot,FT_Render_Mode mode,
                         FT_Vector *origin)

{
  FT_Memory memory_00;
  FT_Bool FVar1;
  int iVar2;
  FT_Outline *outline_00;
  FT_Bitmap *bitmap_00;
  uchar *puVar3;
  FT_Bitmap *local_b8;
  FT_Raster_Params params;
  FT_Pos y_shift;
  FT_Pos x_shift;
  FT_Memory memory;
  FT_Bitmap *bitmap;
  FT_Outline *outline;
  FT_Vector *pFStack_28;
  FT_Error error;
  FT_Vector *origin_local;
  FT_GlyphSlot pFStack_18;
  FT_Render_Mode mode_local;
  FT_GlyphSlot slot_local;
  FT_Renderer_conflict render_local;
  
  outline._4_4_ = 0;
  outline_00 = &slot->outline;
  bitmap_00 = &slot->bitmap;
  memory_00 = (render->root).memory;
  y_shift = 0;
  params.clip_box.yMax = 0;
  pFStack_28 = origin;
  origin_local._4_4_ = mode;
  pFStack_18 = slot;
  slot_local = (FT_GlyphSlot)render;
  if (slot->format == render->glyph_format) {
    if ((((mode == FT_RENDER_MODE_NORMAL) || (mode == FT_RENDER_MODE_LIGHT)) ||
        (mode == FT_RENDER_MODE_LCD)) || (mode == FT_RENDER_MODE_LCD_V)) {
      if ((slot->internal->flags & 1) != 0) {
        ft_mem_free(memory_00,(slot->bitmap).buffer);
        (slot->bitmap).buffer = (uchar *)0x0;
        pFStack_18->internal->flags = pFStack_18->internal->flags & 0xfffffffe;
      }
      FVar1 = ft_glyphslot_preset_bitmap(pFStack_18,origin_local._4_4_,pFStack_28);
      if (FVar1 == '\0') {
        if ((bitmap_00->rows != 0) && ((slot->bitmap).pitch != 0)) {
          puVar3 = (uchar *)ft_mem_realloc(memory_00,(long)(slot->bitmap).pitch,0,
                                           (ulong)bitmap_00->rows,(void *)0x0,
                                           (FT_Error *)((long)&outline + 4));
          (slot->bitmap).buffer = puVar3;
          if (outline._4_4_ == 0) {
            pFStack_18->internal->flags = pFStack_18->internal->flags | 1;
            y_shift = (FT_Pos)(pFStack_18->bitmap_left * -0x40);
            if ((slot->bitmap).pixel_mode == '\x06') {
              iVar2 = (int)(bitmap_00->rows << 6) / 3;
            }
            else {
              iVar2 = bitmap_00->rows << 6;
            }
            params.clip_box.yMax = (long)iVar2 + (long)(pFStack_18->bitmap_top * -0x40);
            if (pFStack_28 != (FT_Vector *)0x0) {
              y_shift = pFStack_28->x + y_shift;
              params.clip_box.yMax = pFStack_28->y + params.clip_box.yMax;
            }
            if ((y_shift != 0) || (params.clip_box.yMax != 0)) {
              FT_Outline_Translate(outline_00,y_shift,params.clip_box.yMax);
            }
            if ((origin_local._4_4_ == FT_RENDER_MODE_NORMAL) ||
               (origin_local._4_4_ == FT_RENDER_MODE_LIGHT)) {
              if (((slot->outline).flags & 0x40U) == 0) {
                params.source._0_4_ = 1;
                local_b8 = bitmap_00;
                params.target = (FT_Bitmap *)outline_00;
                outline._4_4_ =
                     (*(code *)slot_local->linearHoriAdvance)
                               ((slot_local->metrics).vertAdvance,&local_b8);
              }
              else {
                outline._4_4_ =
                     ft_smooth_raster_overlap((FT_Renderer_conflict)slot_local,outline_00,bitmap_00)
                ;
              }
            }
            else if (origin_local._4_4_ == FT_RENDER_MODE_LCD) {
              outline._4_4_ =
                   ft_smooth_raster_lcd((FT_Renderer_conflict)slot_local,outline_00,bitmap_00);
            }
            else if (origin_local._4_4_ == FT_RENDER_MODE_LCD_V) {
              outline._4_4_ =
                   ft_smooth_raster_lcdv((FT_Renderer_conflict)slot_local,outline_00,bitmap_00);
            }
          }
        }
      }
      else {
        outline._4_4_ = 0x62;
      }
    }
    else {
      outline._4_4_ = 0x13;
    }
  }
  else {
    outline._4_4_ = 6;
  }
  if (outline._4_4_ == 0) {
    pFStack_18->format = FT_GLYPH_FORMAT_BITMAP;
  }
  else if ((pFStack_18->internal->flags & 1) != 0) {
    ft_mem_free(memory_00,(slot->bitmap).buffer);
    (slot->bitmap).buffer = (uchar *)0x0;
    pFStack_18->internal->flags = pFStack_18->internal->flags & 0xfffffffe;
  }
  if ((y_shift != 0) || (params.clip_box.yMax != 0)) {
    FT_Outline_Translate(outline_00,-y_shift,-params.clip_box.yMax);
  }
  return outline._4_4_;
}

Assistant:

static FT_Error
  ft_smooth_render( FT_Renderer       render,
                    FT_GlyphSlot      slot,
                    FT_Render_Mode    mode,
                    const FT_Vector*  origin )
  {
    FT_Error     error   = FT_Err_Ok;
    FT_Outline*  outline = &slot->outline;
    FT_Bitmap*   bitmap  = &slot->bitmap;
    FT_Memory    memory  = render->root.memory;
    FT_Pos       x_shift = 0;
    FT_Pos       y_shift = 0;


    /* check glyph image format */
    if ( slot->format != render->glyph_format )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* check mode */
    if ( mode != FT_RENDER_MODE_NORMAL &&
         mode != FT_RENDER_MODE_LIGHT  &&
         mode != FT_RENDER_MODE_LCD    &&
         mode != FT_RENDER_MODE_LCD_V  )
    {
      error = FT_THROW( Cannot_Render_Glyph );
      goto Exit;
    }

    /* release old bitmap buffer */
    if ( slot->internal->flags & FT_GLYPH_OWN_BITMAP )
    {
      FT_FREE( bitmap->buffer );
      slot->internal->flags &= ~FT_GLYPH_OWN_BITMAP;
    }

    if ( ft_glyphslot_preset_bitmap( slot, mode, origin ) )
    {
      error = FT_THROW( Raster_Overflow );
      goto Exit;
    }

    if ( !bitmap->rows || !bitmap->pitch )
      goto Exit;

    /* allocate new one */
    if ( FT_ALLOC_MULT( bitmap->buffer, bitmap->rows, bitmap->pitch ) )
      goto Exit;

    slot->internal->flags |= FT_GLYPH_OWN_BITMAP;

    x_shift = 64 * -slot->bitmap_left;
    y_shift = 64 * -slot->bitmap_top;
    if ( bitmap->pixel_mode == FT_PIXEL_MODE_LCD_V )
      y_shift += 64 * (FT_Int)bitmap->rows / 3;
    else
      y_shift += 64 * (FT_Int)bitmap->rows;

    if ( origin )
    {
      x_shift += origin->x;
      y_shift += origin->y;
    }

    /* translate outline to render it into the bitmap */
    if ( x_shift || y_shift )
      FT_Outline_Translate( outline, x_shift, y_shift );

    if ( mode == FT_RENDER_MODE_NORMAL ||
         mode == FT_RENDER_MODE_LIGHT  )
    {
      if ( outline->flags & FT_OUTLINE_OVERLAP )
        error = ft_smooth_raster_overlap( render, outline, bitmap );
      else
      {
        FT_Raster_Params  params;


        params.target = bitmap;
        params.source = outline;
        params.flags  = FT_RASTER_FLAG_AA;

        error = render->raster_render( render->raster, &params );
      }
    }
    else
    {
      if ( mode == FT_RENDER_MODE_LCD )
        error = ft_smooth_raster_lcd ( render, outline, bitmap );
      else if ( mode == FT_RENDER_MODE_LCD_V )
        error = ft_smooth_raster_lcdv( render, outline, bitmap );

#ifdef FT_CONFIG_OPTION_SUBPIXEL_RENDERING

      /* finally apply filtering */
      {
        FT_Byte*                 lcd_weights;
        FT_Bitmap_LcdFilterFunc  lcd_filter_func;


        /* Per-face LCD filtering takes priority if set up. */
        if ( slot->face && slot->face->internal->lcd_filter_func )
        {
          lcd_weights     = slot->face->internal->lcd_weights;
          lcd_filter_func = slot->face->internal->lcd_filter_func;
        }
        else
        {
          lcd_weights     = slot->library->lcd_weights;
          lcd_filter_func = slot->library->lcd_filter_func;
        }

        if ( lcd_filter_func )
          lcd_filter_func( bitmap, lcd_weights );
      }

#endif /* FT_CONFIG_OPTION_SUBPIXEL_RENDERING */

    }

  Exit:
    if ( !error )
    {
      /* everything is fine; the glyph is now officially a bitmap */
      slot->format = FT_GLYPH_FORMAT_BITMAP;
    }
    else if ( slot->internal->flags & FT_GLYPH_OWN_BITMAP )
    {
      FT_FREE( bitmap->buffer );
      slot->internal->flags &= ~FT_GLYPH_OWN_BITMAP;
    }

    if ( x_shift || y_shift )
      FT_Outline_Translate( outline, -x_shift, -y_shift );

    return error;
  }